

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type sVar1;
  long *plVar2;
  pointer pcVar3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ostream *poVar8;
  size_t sVar9;
  undefined8 extraout_RAX;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pcVar12;
  char *unaff_R14;
  ulong uVar13;
  long lVar14;
  vector<codept,_std::allocator<codept>_> tab;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields_1;
  codept code;
  ofstream out;
  ifstream in;
  char line [1024];
  undefined1 auStack_8e8 [15];
  allocator<char> local_8d9;
  vector<codept,_std::allocator<codept>_> local_8d8;
  undefined1 local_8b8 [24];
  undefined8 uStack_8a0;
  char **local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  value_type local_870;
  undefined1 local_848 [8];
  pointer pbStack_840;
  pointer local_838;
  uint auStack_830 [50];
  char acStack_768 [24];
  ios_base local_750 [272];
  long local_640 [4];
  byte abStack_620 [488];
  byte local_438 [1032];
  
  local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_870.descr._M_dataplus._M_p = (pointer)&local_870.descr.field_2;
  local_870.descr._M_string_length = 0;
  local_870.descr.field_2._M_local_buf[0] = '\0';
  puts("gen_casetab running. Command line is:");
  if (argc < 1) {
    putchar(10);
  }
  else {
    unaff_R14 = "`%s` ";
    uVar13 = 0;
    do {
      printf("`%s` ",argv[uVar13]);
      uVar13 = uVar13 + 1;
    } while ((uint)argc != uVar13);
    putchar(10);
    if (argc != 1) {
      std::ifstream::ifstream(local_640,argv[1],_S_in);
      local_898 = argv;
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 != '\0') {
        puts("Starting...");
        if ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) == 0) {
          do {
            local_848 = (undefined1  [8])0x0;
            pbStack_840 = (pointer)0x0;
            local_838 = (pointer)0x0;
            std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + (char)local_640);
            std::istream::getline((char *)local_640,(long)local_438,'\0');
            if ((0x23 < (ulong)local_438[0]) ||
               ((0x800002001U >> ((ulong)local_438[0] & 0x3f) & 1) == 0)) {
              bVar6 = parse((char *)local_438,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_848);
              if (bVar6) {
                if (((pointer)((long)local_848 + 0x1a0))->_M_string_length != 0) {
                  lVar14 = strtol(((_Alloc_hider *)local_848)->_M_p,(char **)0x0,0x10);
                  local_870.uc = (int)lVar14;
                  lVar14 = strtol((((pointer)((long)local_848 + 0x1a0))->_M_dataplus)._M_p,
                                  (char **)0x0,0x10);
                  local_870.lc = (int)lVar14;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(&local_870.descr,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)local_848 + 0x20));
                  std::vector<codept,_std::allocator<codept>_>::push_back(&local_8d8,&local_870);
                }
              }
              else {
                printf("Cannot parse line:\n%s\n",local_438);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_848);
          } while ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) == 0);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_890,local_898[2],&local_8d9);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_890,"/uppertab.h");
        local_8b8._0_8_ = (pbVar7->_M_dataplus)._M_p;
        paVar11 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._0_8_ == paVar11) {
          local_8b8._16_8_ = paVar11->_M_allocated_capacity;
          uStack_8a0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_8b8._0_8_ = (pointer)(local_8b8 + 0x10);
        }
        else {
          local_8b8._16_8_ = paVar11->_M_allocated_capacity;
        }
        local_8b8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::ofstream::ofstream(local_848,(string *)local_8b8,_S_out);
        if ((pointer)local_8b8._0_8_ != (pointer)(local_8b8 + 0x10)) {
          operator_delete((void *)local_8b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_8b8._16_8_)->_M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_848,"//Upper case table",0x12);
        std::ios::widen((char)(ostream *)local_848 +
                        (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        cVar5 = (char)(ostream *)local_848;
        std::ostream::put(cVar5);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"static const char32_t u2l [",0x1b);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = { ",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 8;
        if (local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar14 = 0;
          uVar13 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"  0x",4);
            sVar1 = ((pointer)((long)local_848 + -0x20))->_M_string_length;
            if (acStack_768[sVar1 + 1] == '\0') {
              std::ios::widen((char)auStack_8e8 + (char)sVar1 + -0x60);
              acStack_768[sVar1 + 1] = '\x01';
            }
            acStack_768[sVar1] = '0';
            *(undefined8 *)
             ((long)auStack_830 + (((pointer)((long)local_848 + -0x20))->_M_string_length - 8)) = 5;
            std::ostream::operator<<
                      ((ostream *)local_848,
                       *(int *)((long)&(local_8d8.
                                        super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                        super__Vector_impl_data._M_start)->uc + lVar14));
            pcVar10 = ", ";
            if (uVar13 == ((long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333 - 1U) {
              pcVar10 = "};";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"// ",3);
            pcVar10 = *(char **)((long)&((local_8d8.
                                          super__Vector_base<codept,_std::allocator<codept>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->descr).
                                        _M_dataplus._M_p + lVar14);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)auStack_8e8 +
                              (int)((pointer)((long)local_848 + -0x20))->_M_string_length + 0xa0);
            }
            else {
              sVar9 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,sVar9)
              ;
            }
            std::ios::widen((char)((pointer)((long)local_848 + -0x20))->_M_string_length + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x28;
          } while (uVar13 < (ulong)(((long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 2;
        std::ios::widen(cVar5 + (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        std::ostream::put((char)local_848);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_848,"//Lower case equivalents",0x18);
        std::ios::widen((char)(ostream *)local_848 +
                        (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        cVar5 = (char)(ostream *)local_848;
        std::ostream::put(cVar5);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"static const char32_t lc [",0x1a)
        ;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = { ",6);
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 8;
        if (local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar14 = 4;
          uVar13 = 0;
          do {
            if ((uVar13 & 7) == 0) {
              std::ios::widen((char)((pointer)((long)local_848 + -0x20))->_M_string_length + cVar5);
              std::ostream::put(cVar5);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"0x",2);
            sVar1 = ((pointer)((long)local_848 + -0x20))->_M_string_length;
            if (acStack_768[sVar1 + 1] == '\0') {
              std::ios::widen((char)auStack_8e8 + (char)sVar1 + -0x60);
              acStack_768[sVar1 + 1] = '\x01';
            }
            acStack_768[sVar1] = '0';
            *(undefined8 *)
             ((long)auStack_830 + (((pointer)((long)local_848 + -0x20))->_M_string_length - 8)) = 5;
            std::ostream::operator<<
                      ((ostream *)local_848,
                       *(int *)((long)&(local_8d8.
                                        super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                        super__Vector_impl_data._M_start)->uc + lVar14));
            pcVar10 = ", ";
            if (uVar13 == ((long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333 - 1U) {
              pcVar10 = "};";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,2);
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x28;
          } while (uVar13 < (ulong)(((long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        std::ofstream::close();
        std::ios::clear((int)local_640 + (int)*(undefined8 *)(local_640[0] + -0x18));
        std::istream::seekg(local_640,0,0);
        pcVar4 = local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar3 = local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_start) {
          paVar11 = &((local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                       super__Vector_impl_data._M_start)->descr).field_2;
          do {
            plVar2 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar11->_M_allocated_capacity + 1);
            }
            pcVar12 = (pointer)(paVar11 + 1);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar11 + 0x28);
          } while (pcVar12 != pcVar4);
          local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar3;
        }
        if ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) == 0) {
          do {
            local_8b8._0_8_ = (pointer)0x0;
            local_8b8._8_8_ = (pointer)0x0;
            local_8b8._16_8_ = (pointer)0x0;
            std::ios::widen((char)*(undefined8 *)(local_640[0] + -0x18) + (char)local_640);
            std::istream::getline((char *)local_640,(long)local_438,'\0');
            if (((0x23 < (ulong)local_438[0]) ||
                ((0x800002001U >> ((ulong)local_438[0] & 0x3f) & 1) == 0)) &&
               (parse((char *)local_438,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_8b8), ((pointer)(local_8b8._0_8_ + 0x180))->_M_string_length != 0)) {
              lVar14 = strtol((((pointer)(local_8b8._0_8_ + 0x180))->_M_dataplus)._M_p,(char **)0x0,
                              0x10);
              local_870.uc = (int)lVar14;
              lVar14 = strtol(((_Alloc_hider *)local_8b8._0_8_)->_M_p,(char **)0x0,0x10);
              local_870.lc = (int)lVar14;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_870.descr,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_8b8._0_8_ + 0x20));
              std::vector<codept,_std::allocator<codept>_>::push_back(&local_8d8,&local_870);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_8b8);
          } while ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) == 0);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_890,local_898[2],&local_8d9);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_890,"/lowertab.h");
        local_8b8._0_8_ = (pbVar7->_M_dataplus)._M_p;
        paVar11 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._0_8_ == paVar11) {
          local_8b8._16_8_ = paVar11->_M_allocated_capacity;
          uStack_8a0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_8b8._0_8_ = (pointer)(local_8b8 + 0x10);
        }
        else {
          local_8b8._16_8_ = paVar11->_M_allocated_capacity;
        }
        local_8b8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::ofstream::open((string *)local_848,(_Ios_Openmode)local_8b8);
        if ((pointer)local_8b8._0_8_ != (pointer)(local_8b8 + 0x10)) {
          operator_delete((void *)local_8b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_8b8._16_8_)->_M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_848,"//Lower case table",0x12);
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 2;
        std::ios::widen((char)(ostream *)local_848 +
                        (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        cVar5 = (char)(ostream *)local_848;
        std::ostream::put(cVar5);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"static const char32_t l2u [",0x1b);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = { ",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 8;
        if (local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar14 = 0;
          uVar13 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"  0x",4);
            sVar1 = ((pointer)((long)local_848 + -0x20))->_M_string_length;
            if (acStack_768[sVar1 + 1] == '\0') {
              std::ios::widen((char)auStack_8e8 + (char)sVar1 + -0x60);
              acStack_768[sVar1 + 1] = '\x01';
            }
            acStack_768[sVar1] = '0';
            *(undefined8 *)
             ((long)auStack_830 + (((pointer)((long)local_848 + -0x20))->_M_string_length - 8)) = 5;
            std::ostream::operator<<
                      ((ostream *)local_848,
                       *(int *)((long)&(local_8d8.
                                        super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                        super__Vector_impl_data._M_start)->lc + lVar14));
            pcVar10 = ", ";
            if (uVar13 == ((long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333 - 1U) {
              pcVar10 = "};";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"// ",3);
            pcVar10 = *(char **)((long)&((local_8d8.
                                          super__Vector_base<codept,_std::allocator<codept>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->descr).
                                        _M_dataplus._M_p + lVar14);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)auStack_8e8 +
                              (int)((pointer)((long)local_848 + -0x20))->_M_string_length + 0xa0);
            }
            else {
              sVar9 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,sVar9)
              ;
            }
            std::ios::widen((char)((pointer)((long)local_848 + -0x20))->_M_string_length + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x28;
          } while (uVar13 < (ulong)(((long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 2;
        std::ios::widen(cVar5 + (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        std::ostream::put((char)local_848);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_848,"//Upper case equivalents",0x18);
        std::ios::widen((char)(ostream *)local_848 +
                        (char)((pointer)((long)local_848 + -0x20))->_M_string_length);
        cVar5 = (char)(ostream *)local_848;
        std::ostream::put(cVar5);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"static const char32_t uc [",0x1a)
        ;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = { ",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) =
             *(uint *)((long)auStack_830 + ((pointer)((long)local_848 + -0x20))->_M_string_length) &
             0xffffffb5 | 8;
        if (local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_8d8.super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar14 = 0;
          uVar13 = 0;
          do {
            if ((uVar13 & 7) == 0) {
              std::ios::widen((char)((pointer)((long)local_848 + -0x20))->_M_string_length + cVar5);
              std::ostream::put(cVar5);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,"0x",2);
            sVar1 = ((pointer)((long)local_848 + -0x20))->_M_string_length;
            if (acStack_768[sVar1 + 1] == '\0') {
              std::ios::widen((char)auStack_8e8 + (char)sVar1 + -0x60);
              acStack_768[sVar1 + 1] = '\x01';
            }
            acStack_768[sVar1] = '0';
            *(undefined8 *)
             ((long)auStack_830 + (((pointer)((long)local_848 + -0x20))->_M_string_length - 8)) = 5;
            std::ostream::operator<<
                      ((ostream *)local_848,
                       *(int *)((long)&(local_8d8.
                                        super__Vector_base<codept,_std::allocator<codept>_>._M_impl.
                                        super__Vector_impl_data._M_start)->uc + lVar14));
            pcVar10 = ", ";
            if (uVar13 == ((long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_8d8.super__Vector_base<codept,_std::allocator<codept>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333 - 1U) {
              pcVar10 = "};";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_848,pcVar10,2);
            uVar13 = uVar13 + 1;
            lVar14 = lVar14 + 0x28;
          } while (uVar13 < (ulong)(((long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_8d8.
                                           super__Vector_base<codept,_std::allocator<codept>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        std::ofstream::close();
        std::ifstream::close();
        local_848 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_848 + _VTT[-1]._M_string_length) = __filebuf;
        std::filebuf::~filebuf((filebuf *)&pbStack_840);
        std::ios_base::~ios_base(local_750);
        std::ifstream::~ifstream(local_640);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_870.descr._M_dataplus._M_p != &local_870.descr.field_2) {
          operator_delete(local_870.descr._M_dataplus._M_p,
                          CONCAT71(local_870.descr.field_2._M_allocated_capacity._1_7_,
                                   local_870.descr.field_2._M_local_buf[0]) + 1);
        }
        std::vector<codept,_std::allocator<codept>_>::~vector(&local_8d8);
        return 0;
      }
      goto LAB_001034c0;
    }
  }
  main_cold_2();
LAB_001034c0:
  main_cold_1();
  if ((char *)local_8b8._0_8_ != unaff_R14) {
    operator_delete((void *)local_8b8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_8b8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::~ofstream(local_848);
  std::ifstream::~ifstream(local_640);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.descr._M_dataplus._M_p != &local_870.descr.field_2) {
    operator_delete(local_870.descr._M_dataplus._M_p,
                    CONCAT71(local_870.descr.field_2._M_allocated_capacity._1_7_,
                             local_870.descr.field_2._M_local_buf[0]) + 1);
  }
  std::vector<codept,_std::allocator<codept>_>::~vector(&local_8d8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main (int argc, char **argv)
{
  char line[1024];
  vector<codept> tab;

  codept code;
  printf ("gen_casetab running. Command line is:\n");
  for (int i = 0; i < argc; i++)
  {
    printf ("`%s` ", argv[i]);
  }
  printf ("\n");

  if (argc < 2)
  {
    fprintf (stderr, "Usage: gen_casetab <input table> <output folder>\n");
    exit (1);
  }
  ifstream in (argv[1]);

  if (!in.is_open ())
  {
    fprintf (stderr, "gen_casetab: cannot open input table: %s\n", argv[1]);
    exit (1);
  }
  printf ("Starting...\n");

  //Generate upper case -> lower case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen(line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    if (!parse (line, fields))
    {
      printf ("Cannot parse line:\n%s\n", line);
      continue;
    }
    if (fields[LC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[CODE_FIELD].c_str(), nullptr, 16);
    code.lc = strtol (fields[LC_FIELD].c_str(), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  ofstream out (string(argv[2]) + "/uppertab.h");
  out << "//Upper case table" << endl
    << "static const char32_t u2l [" << tab.size() << "] = { " << endl;
  out << hex;
  for (size_t i=0; i<tab.size(); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str() << endl;
  }
  out << dec << endl;
  out << "//Lower case equivalents" << endl
    << "static const char32_t lc [" << tab.size () << "] = { ";
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.clear ();
  in.seekg (0); //rewind
  tab.clear ();

  //Generate lower case -> upper case table
  while (in)
  {
    vector<string> fields;
    in.getline (line, sizeof (line));
    // printf ("%s\n", line);
    if (!strlen (line) || line[0] == '#' || line[0] == '\r')
      continue; //ignore empty and comment lines
    parse (line, fields);
    if (fields[UC_FIELD].empty ())
      continue;

    code.uc = strtol (fields[UC_FIELD].c_str (), nullptr, 16);
    code.lc = strtol (fields[CODE_FIELD].c_str (), nullptr, 16);
    code.descr = fields[DESCR_FIELD];
    tab.push_back (code);
  }

  out.open (string(argv[2]) + "/lowertab.h");
  out << "//Lower case table" << dec << endl
    << "static const char32_t l2u [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    out << "  0x" << std::setfill ('0') << std::setw (5) << tab[i].lc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
    out << "// " << tab[i].descr.c_str () << endl;
  }
  out << dec << endl;
  out << "//Upper case equivalents" << endl
    << "static const char32_t uc [" << tab.size () << "] = { " << endl;
  out << hex;
  for (size_t i = 0; i < tab.size (); i++)
  {
    if (i % 8 == 0)
      out << endl << "  ";
    out << "0x" << std::setfill ('0') << std::setw (5) << tab[i].uc;
    if (i == tab.size () - 1)
      out << "};";
    else
      out << ", ";
  }
  out.close ();

  in.close ();
  return 0;
}